

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list.c
# Opt level: O3

node * list_insert_node(list *list,node *node)

{
  node *pnVar1;
  node **ppnVar2;
  list *plVar3;
  
  if (node == (node *)0x0 || list == (list *)0x0) {
    node = (node *)0x0;
  }
  else {
    pnVar1 = list->head;
    if (pnVar1 == (node *)0x0) {
      list->head = node;
      ppnVar2 = &list->tail;
    }
    else {
      node->next = pnVar1;
      plVar3 = list;
      if (pnVar1->previous != (node *)0x0) {
        node->previous = pnVar1;
        plVar3 = (list *)pnVar1->previous;
      }
      ppnVar2 = &pnVar1->previous;
      plVar3->head = node;
    }
    *ppnVar2 = node;
    list->size = list->size + 1;
  }
  return node;
}

Assistant:

struct node *list_insert_node(struct list *list, struct node *node)
{
        if (list == NULL || node == NULL) {
                return NULL;
        }

        if (list->head == NULL) {
                list->head = node;
                list->tail = node;

                ++list->size;

                return node;
        } else {
                return list_insert_node_before(list, list->head, node);
        }
}